

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O3

void fill_xrange(chunk *c,wchar_t y,wchar_t x1,wchar_t x2,wchar_t feat,wchar_t flag,_Bool light)

{
  loc grid;
  square *psVar1;
  
  if (x1 <= x2) {
    do {
      grid = (loc)loc(x1,y);
      square_set_feat((chunk_conflict *)c,grid,feat);
      psVar1 = square((chunk_conflict *)c,grid);
      flag_on_dbg(psVar1->info,3,4,"square(c, grid)->info","SQUARE_ROOM");
      if (flag != L'\0') {
        psVar1 = square((chunk_conflict *)c,grid);
        flag_on_dbg(psVar1->info,3,flag,"square(c, grid)->info","flag");
      }
      if (light) {
        psVar1 = square((chunk_conflict *)c,grid);
        flag_on_dbg(psVar1->info,3,2,"square(c, grid)->info","SQUARE_GLOW");
      }
      x1 = x1 + L'\x01';
    } while (x2 + L'\x01' != x1);
  }
  return;
}

Assistant:

static void fill_xrange(struct chunk *c, int y, int x1, int x2, int feat, 
						int flag, bool light)
{
	int x;
	for (x = x1; x <= x2; x++) {
		struct loc grid = loc(x, y);
		square_set_feat(c, grid, feat);
		sqinfo_on(square(c, grid)->info, SQUARE_ROOM);
		if (flag) sqinfo_on(square(c, grid)->info, flag);
		if (light)
			sqinfo_on(square(c, grid)->info, SQUARE_GLOW);
	}
}